

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

bool __thiscall Json::Value::asBool(Value *this)

{
  string local_1c0;
  ostringstream local_190 [8];
  ostringstream oss;
  Value *this_local;
  
  switch(this->field_0x8) {
  case 0:
    this_local._7_1_ = false;
    break;
  case 1:
    this_local._7_1_ = (this->value_).int_ != 0;
    break;
  case 2:
    this_local._7_1_ = (this->value_).int_ != 0;
    break;
  case 3:
    this_local._7_1_ = (this->value_).real_ != 0.0;
    break;
  default:
    std::__cxx11::ostringstream::ostringstream(local_190);
    std::operator<<((ostream *)local_190,"Value is not convertible to bool.");
    std::__cxx11::ostringstream::str();
    throwLogicError(&local_1c0);
  case 5:
    this_local._7_1_ = (bool)((this->value_).bool_ & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool Value::asBool() const {
  switch (type_) {
  case booleanValue:
    return value_.bool_;
  case nullValue:
    return false;
  case intValue:
    return value_.int_ ? true : false;
  case uintValue:
    return value_.uint_ ? true : false;
  case realValue:
    // This is kind of strange. Not recommended.
    return (value_.real_ != 0.0) ? true : false;
  default:
    break;
  }
  JSON_FAIL_MESSAGE("Value is not convertible to bool.");
}